

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::
parse_inline_table<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_04;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  syntax_error *psVar4;
  error_type *this_00;
  value_type *this_01;
  internal_error *this_02;
  error_type *__rhs;
  reference pcVar5;
  type l;
  undefined7 uVar7;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
  *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
  *v_02;
  uint in_stack_ffffffffffffec4c;
  undefined1 in_stack_ffffffffffffec50;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_11b8;
  source_location local_1168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1118;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10f2;
  undefined1 local_10f1;
  source_location local_10f0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10a0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1098;
  iterator local_1028;
  size_type local_1020;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1018;
  allocator<char> local_ff9;
  string local_ff8;
  string local_fd8;
  __node_base_ptr local_fb8;
  undefined1 local_fa9;
  source_location local_fa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f58;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f32;
  undefined1 local_f31;
  source_location local_f30;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_ee0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ed8;
  iterator local_e68;
  size_type local_e60;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e58;
  allocator<char> local_e39;
  string local_e38;
  string local_e18;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_df8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_df0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_de8;
  result<toml::detail::region,_toml::detail::none_t> local_de0;
  undefined1 local_d89;
  source_location local_d88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d38;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d1a;
  undefined1 local_d19;
  source_location local_d18;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_cc8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cc0;
  iterator local_c50;
  size_type local_c48;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c40;
  allocator<char> local_c21;
  string local_c20;
  string local_c00;
  undefined1 local_bd9;
  source_location local_bd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b88;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b62;
  undefined1 local_b61;
  source_location local_b60;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b10;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b08;
  iterator local_a98;
  size_type local_a90;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a88;
  allocator<char> local_a69;
  string local_a68;
  string local_a48;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_a28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_a20;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_a18;
  char *local_a10;
  const_iterator local_a08;
  region local_a00;
  pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
  local_9b8;
  success<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>_>
  local_938;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_8b8;
  undefined1 local_8a9;
  source_location local_8a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_858;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_832;
  undefined1 local_831;
  source_location local_830;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_7e0;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7d8;
  iterator local_768;
  size_type local_760;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_758;
  allocator<char> local_739;
  string local_738;
  string local_718;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_6f8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_6f0;
  result<toml::detail::region,_toml::detail::none_t> local_6e8;
  undefined1 local_698 [8];
  result<toml::detail::region,_toml::detail::none_t> sp;
  source_location local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  region local_5d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_588;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *local_580;
  undefined1 local_578 [8];
  result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  inserted;
  value_type *val;
  region *key_reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys;
  value_type *kvpair;
  undefined1 local_510 [8];
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  kv_r;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_458;
  char *local_450;
  const_iterator local_448;
  region local_440;
  pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
  local_3f8;
  success<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>_>
  local_378;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_2f8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_2f0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_2e8;
  result<toml::detail::region,_toml::detail::none_t> local_2e0;
  int local_28c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_262;
  undefined1 local_261;
  source_location local_260;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_210;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  iterator local_198;
  size_type local_190;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  allocator<char> local_169;
  string local_168;
  string local_148;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_108;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_100;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_f8;
  undefined1 local_f0 [8];
  table_type retval;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first;
  source_location local_a8;
  allocator<char> local_41;
  string local_40;
  location *local_20;
  size_t n_rec_local;
  location *loc_local;
  
  local_20 = loc;
  n_rec_local = (size_t)this;
  loc_local = (location *)__return_storage_ptr__;
  if ((location *)0x40 < loc) {
    psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"toml::parse_inline_table: recursion limit (64) exceeded",
               &local_41);
    source_location::source_location(&local_a8,(location *)n_rec_local);
    syntax_error::syntax_error(psVar4,&local_40,&local_a8);
    __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
  }
  retval._M_h._M_single_bucket = (__node_base_ptr)location::iter((location *)this);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                   *)local_f0);
  local_f8._M_current = (char *)location::iter((location *)n_rec_local);
  local_100._M_current = (char *)location::end((location *)n_rec_local);
  bVar2 = __gnu_cxx::operator!=(&local_f8,&local_100);
  uVar7 = (undefined7)(n_rec >> 8);
  bVar3 = false;
  if (bVar2) {
    local_108._M_current = (char *)location::iter((location *)n_rec_local);
    pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_108);
    bVar3 = *pcVar5 == '{';
  }
  if (bVar3) {
    location::advance((location *)n_rec_local,1);
    maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
    ::invoke(&local_2e0,(location *)n_rec_local);
    result<toml::detail::region,_toml::detail::none_t>::~result(&local_2e0);
    local_2e8._M_current = (char *)location::iter((location *)n_rec_local);
    local_2f0._M_current = (char *)location::end((location *)n_rec_local);
    bVar2 = __gnu_cxx::operator!=(&local_2e8,&local_2f0);
    l._M_current = (char *)CONCAT71(uVar7,bVar2);
    bVar3 = false;
    if (bVar2) {
      local_2f8._M_current = (char *)location::iter((location *)n_rec_local);
      pcVar5 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&local_2f8);
      bVar3 = *pcVar5 == '}';
    }
    if (bVar3) {
      location::advance((location *)n_rec_local,1);
      sVar1 = n_rec_local;
      local_448._M_current = (char *)retval._M_h._M_single_bucket;
      local_450 = (char *)location::iter((location *)n_rec_local);
      region::region(&local_440,(location *)sVar1,local_448,(const_iterator)local_450);
      std::
      make_pair<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>&,toml::detail::region>
                (&local_3f8,
                 (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                  *)local_f0,&local_440);
      ok<std::pair<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>,toml::detail::region>>
                (&local_378,(toml *)&local_3f8,v_00);
      result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_378);
      success<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>_>
      ::~success(&local_378);
      std::
      pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
      ::~pair(&local_3f8);
      region::~region(&local_440);
      local_28c = 1;
    }
    else {
      do {
        local_458._M_current = (char *)location::iter((location *)n_rec_local);
        kv_r.field_1._160_8_ = location::end((location *)n_rec_local);
        bVar3 = __gnu_cxx::operator!=
                          (&local_458,
                           (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                            *)&kv_r.field_1.succ.value.second.field_0x40);
        if (!bVar3) {
          local_fb8 = retval._M_h._M_single_bucket;
          location::reset((location *)n_rec_local,(const_iterator)retval._M_h._M_single_bucket);
          psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_ff8,
                     "toml::parse_inline_table: inline table did not closed by `}`",&local_ff9);
          local_10f1 = 1;
          local_10a0 = &local_1098;
          source_location::source_location(&local_10f0,(location *)n_rec_local);
          std::
          pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<toml::source_location,_const_char_(&)[17],_true>
                    (&local_1098,&local_10f0,(char (*) [17])"should be closed");
          local_10f1 = 0;
          local_1028 = &local_1098;
          local_1020 = 1;
          std::
          allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::allocator(&local_10f2);
          __l._M_len = local_1020;
          __l._M_array = local_1028;
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector(&local_1018,__l,&local_10f2);
          local_1118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1118.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_1118);
          format_underline(&local_fd8,&local_ff8,&local_1018,&local_1118,false);
          source_location::source_location(&local_1168,(location *)n_rec_local);
          syntax_error::syntax_error(psVar4,&local_fd8,&local_1168);
          __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
        }
        parse_key_value_pair<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                  ((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_510,(detail *)n_rec_local,
                   (location *)((long)&(local_20->super_region_base)._vptr_region_base + 1),
                   (size_t)l._M_current);
        bVar3 = toml::result::operator_cast_to_bool((result *)local_510);
        if (bVar3) {
          this_01 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_510);
          inserted.field_1._24_8_ = &this_01->second;
          local_580 = (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this_01);
          local_588._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_01);
          region::region(&local_5d0,&(this_01->first).second);
          pbVar6 = local_580;
          insert_nested_key<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_578,(detail *)local_f0,(table_type *)&this_01->second,local_580,
                     local_588,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5d0
                     ,(region *)((ulong)in_stack_ffffffffffffec4c << 0x20),
                     (bool)in_stack_ffffffffffffec50);
          region::~region(&local_5d0);
          bVar3 = toml::result::operator_cast_to_bool((result *)local_578);
          if (!bVar3) {
            sp.field_1._71_1_ = 1;
            this_02 = (internal_error *)__cxa_allocate_exception(0x78);
            __rhs = result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::unwrap_err((result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_578);
            std::operator+(&local_5f0,
                           "toml::parse_inline_table: failed to insert value into table: ",__rhs);
            source_location::source_location(&local_640,(location *)n_rec_local);
            internal_error::internal_error(this_02,&local_5f0,&local_640);
            sp.field_1._71_1_ = 0;
            __cxa_throw(this_02,&internal_error::typeinfo,internal_error::~internal_error);
          }
          sequence<toml::detail::maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>,_toml::detail::character<','>_>
          ::invoke((result<toml::detail::region,_toml::detail::none_t> *)local_698,
                   (location *)n_rec_local);
          bVar3 = toml::result::operator_cast_to_bool((result *)local_698);
          if (bVar3) {
            maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
            ::invoke(&local_de0,(location *)n_rec_local);
            result<toml::detail::region,_toml::detail::none_t>::~result(&local_de0);
            local_de8._M_current = (char *)location::iter((location *)n_rec_local);
            local_df0._M_current = (char *)location::end((location *)n_rec_local);
            bVar2 = __gnu_cxx::operator!=(&local_de8,&local_df0);
            l._M_current = (char *)CONCAT71((int7)((ulong)pbVar6 >> 8),bVar2);
            bVar3 = false;
            if (bVar2) {
              local_df8._M_current = (char *)location::iter((location *)n_rec_local);
              pcVar5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator*(&local_df8);
              bVar3 = *pcVar5 == '}';
            }
            if (bVar3) {
              local_fa9 = 1;
              psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e38,
                         "toml::parse_inline_table: trailing comma is not allowed in an inline table"
                         ,&local_e39);
              local_f31 = 1;
              local_ee0 = &local_ed8;
              source_location::source_location(&local_f30,(location *)n_rec_local);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[14],_true>
                        (&local_ed8,&local_f30,(char (*) [14])"should be `}`");
              local_f31 = 0;
              local_e68 = &local_ed8;
              local_e60 = 1;
              std::
              allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::allocator(&local_f32);
              __l_00._M_len = local_e60;
              __l_00._M_array = local_e68;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector(&local_e58,__l_00,&local_f32);
              local_f58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_f58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_f58.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_f58);
              format_underline(&local_e18,&local_e38,&local_e58,&local_f58,false);
              source_location::source_location(&local_fa8,(location *)n_rec_local);
              syntax_error::syntax_error(psVar4,&local_e18,&local_fa8);
              local_fa9 = 0;
              __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
            }
            local_28c = 0;
          }
          else {
            maybe<toml::detail::repeat<toml::detail::either<toml::detail::character<'_'>,_toml::detail::character<'\t'>_>,_toml::detail::at_least<1UL>_>_>
            ::invoke(&local_6e8,(location *)n_rec_local);
            result<toml::detail::region,_toml::detail::none_t>::~result(&local_6e8);
            local_6f0._M_current = (char *)location::iter((location *)n_rec_local);
            local_6f8._M_current = (char *)location::end((location *)n_rec_local);
            bVar3 = __gnu_cxx::operator==(&local_6f0,&local_6f8);
            if (bVar3) {
              local_8a9 = 1;
              psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_738,
                         "toml::parse_inline_table: missing table separator `}` ",&local_739);
              local_831 = 1;
              local_7e0 = &local_7d8;
              source_location::source_location(&local_830,(location *)n_rec_local);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[14],_true>
                        (&local_7d8,&local_830,(char (*) [14])"should be `}`");
              local_831 = 0;
              local_768 = &local_7d8;
              local_760 = 1;
              std::
              allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::allocator(&local_832);
              __l_03._M_len = local_760;
              __l_03._M_array = local_768;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector(&local_758,__l_03,&local_832);
              local_858.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_858.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_858.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_858);
              format_underline(&local_718,&local_738,&local_758,&local_858,false);
              source_location::source_location(&local_8a8,(location *)n_rec_local);
              syntax_error::syntax_error(psVar4,&local_718,&local_8a8);
              local_8a9 = 0;
              __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
            }
            local_8b8._M_current = (char *)location::iter((location *)n_rec_local);
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator*(&local_8b8);
            if (*pcVar5 != '}') {
              local_a18._M_current = (char *)location::iter((location *)n_rec_local);
              pcVar5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator*(&local_a18);
              bVar3 = true;
              if (*pcVar5 != '#') {
                local_a20._M_current = (char *)location::iter((location *)n_rec_local);
                pcVar5 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                         ::operator*(&local_a20);
                bVar3 = true;
                if (*pcVar5 != '\r') {
                  local_a28._M_current = (char *)location::iter((location *)n_rec_local);
                  pcVar5 = __gnu_cxx::
                           __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                           ::operator*(&local_a28);
                  bVar3 = *pcVar5 == '\n';
                }
              }
              if (bVar3) {
                local_bd9 = 1;
                psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_a68,"toml::parse_inline_table: missing curly brace `}`",
                           &local_a69);
                local_b61 = 1;
                local_b10 = &local_b08;
                source_location::source_location(&local_b60,(location *)n_rec_local);
                std::
                pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<toml::source_location,_const_char_(&)[14],_true>
                          (&local_b08,&local_b60,(char (*) [14])"should be `}`");
                local_b61 = 0;
                local_a98 = &local_b08;
                local_a90 = 1;
                std::
                allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::allocator(&local_b62);
                __l_02._M_len = local_a90;
                __l_02._M_array = local_a98;
                std::
                vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector(&local_a88,__l_02,&local_b62);
                local_b88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_b88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_b88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_b88);
                format_underline(&local_a48,&local_a68,&local_a88,&local_b88,false);
                source_location::source_location(&local_bd8,(location *)n_rec_local);
                syntax_error::syntax_error(psVar4,&local_a48,&local_bd8);
                local_bd9 = 0;
                __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
              }
              local_d89 = 1;
              psVar4 = (syntax_error *)__cxa_allocate_exception(0x78);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_c20,
                         "toml::parse_inline_table: missing table separator `,` ",&local_c21);
              local_d19 = 1;
              local_cc8 = &local_cc0;
              source_location::source_location(&local_d18,(location *)n_rec_local);
              std::
              pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<toml::source_location,_const_char_(&)[14],_true>
                        (&local_cc0,&local_d18,(char (*) [14])"should be `,`");
              local_d19 = 0;
              local_c50 = &local_cc0;
              local_c48 = 1;
              std::
              allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::allocator(&local_d1a);
              __l_01._M_len = local_c48;
              __l_01._M_array = local_c50;
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector(&local_c40,__l_01,&local_d1a);
              local_d38.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_d38.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_d38.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_d38);
              format_underline(&local_c00,&local_c20,&local_c40,&local_d38,false);
              source_location::source_location(&local_d88,(location *)n_rec_local);
              syntax_error::syntax_error(psVar4,&local_c00,&local_d88);
              local_d89 = 0;
              __cxa_throw(psVar4,&syntax_error::typeinfo,syntax_error::~syntax_error);
            }
            location::advance((location *)n_rec_local,1);
            sVar1 = n_rec_local;
            local_a08._M_current = (char *)retval._M_h._M_single_bucket;
            l = location::iter((location *)n_rec_local);
            local_a10 = l._M_current;
            region::region(&local_a00,(location *)sVar1,local_a08,(const_iterator)l._M_current);
            std::
            make_pair<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>&,toml::detail::region>
                      (&local_9b8,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                        *)local_f0,&local_a00);
            ok<std::pair<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>,toml::detail::region>>
                      (&local_938,(toml *)&local_9b8,v_02);
            result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::result(__return_storage_ptr__,&local_938);
            success<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>_>
            ::~success(&local_938);
            std::
            pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>
            ::~pair(&local_9b8);
            region::~region(&local_a00);
            local_28c = 1;
          }
          result<toml::detail::region,_toml::detail::none_t>::~result
                    ((result<toml::detail::region,_toml::detail::none_t> *)local_698);
          result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~result((result<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_578);
        }
        else {
          this_00 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::unwrap_err((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_510);
          err<std::__cxx11::string_const&>
                    ((failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&kvpair,(toml *)this_00,v_01);
          result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::result(__return_storage_ptr__,(failure_type *)&kvpair);
          failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~failure((failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&kvpair);
          local_28c = 1;
        }
        result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~result((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_510);
      } while (local_28c == 0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"toml::parse_inline_table: ",&local_169);
    local_261 = 1;
    local_210 = &local_208;
    source_location::source_location(&local_260,(location *)n_rec_local);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[38],_true>
              (&local_208,&local_260,(char (*) [38])"the next token is not an inline table");
    local_261 = 0;
    local_198 = &local_208;
    local_190 = 1;
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_262);
    __l_04._M_len = local_190;
    __l_04._M_array = local_198;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_188,__l_04,&local_262);
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_288);
    format_underline(&local_148,&local_168,&local_188,&local_288,false);
    err<std::__cxx11::string>(&local_128,(toml *)&local_148,v);
    result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_128);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_188);
    std::
    allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_262);
    local_11b8 = (pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198;
    do {
      local_11b8 = local_11b8 + -1;
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_11b8);
    } while (local_11b8 != &local_208);
    source_location::~source_location(&local_260);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    local_28c = 1;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<typename Value::table_type, region>, std::string>
parse_inline_table(location& loc, const std::size_t n_rec)
{
    using value_type = Value;
    using table_type = typename value_type::table_type;

    if(n_rec > TOML11_VALUE_RECURSION_LIMIT)
    {
        throw syntax_error(std::string("toml::parse_inline_table: recursion limit ("
                TOML11_STRINGIZE(TOML11_VALUE_RECURSION_LIMIT) ") exceeded"),
                source_location(loc));
    }

    const auto first = loc.iter();
    table_type retval;
    if(!(loc.iter() != loc.end() && *loc.iter() == '{'))
    {
        return err(format_underline("toml::parse_inline_table: ",
            {{source_location(loc), "the next token is not an inline table"}}));
    }
    loc.advance();

    // check if the inline table is an empty table = { }
    maybe<lex_ws>::invoke(loc);
    if(loc.iter() != loc.end() && *loc.iter() == '}')
    {
        loc.advance(); // skip `}`
        return ok(std::make_pair(retval, region(loc, first, loc.iter())));
    }

    // it starts from "{". it should be formatted as inline-table
    while(loc.iter() != loc.end())
    {
        const auto kv_r = parse_key_value_pair<value_type>(loc, n_rec+1);
        if(!kv_r)
        {
            return err(kv_r.unwrap_err());
        }

        const auto&              kvpair  = kv_r.unwrap();
        const std::vector<key>&  keys    = kvpair.first.first;
        const auto&              key_reg = kvpair.first.second;
        const value_type&        val     = kvpair.second;

        const auto inserted =
            insert_nested_key(retval, val, keys.begin(), keys.end(), key_reg);
        if(!inserted)
        {
            throw internal_error("toml::parse_inline_table: "
                "failed to insert value into table: " + inserted.unwrap_err(),
                source_location(loc));
        }

        using lex_table_separator = sequence<maybe<lex_ws>, character<','>>;
        const auto sp = lex_table_separator::invoke(loc);

        if(!sp)
        {
            maybe<lex_ws>::invoke(loc);

            if(loc.iter() == loc.end())
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing table separator `}` ",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
            else if(*loc.iter() == '}')
            {
                loc.advance(); // skip `}`
                return ok(std::make_pair(
                            retval, region(loc, first, loc.iter())));
            }
            else if(*loc.iter() == '#' || *loc.iter() == '\r' || *loc.iter() == '\n')
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing curly brace `}`",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
            else
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: missing table separator `,` ",
                    {{source_location(loc), "should be `,`"}}),
                    source_location(loc));
            }
        }
        else // `,` is found
        {
            maybe<lex_ws>::invoke(loc);
            if(loc.iter() != loc.end() && *loc.iter() == '}')
            {
                throw syntax_error(format_underline(
                    "toml::parse_inline_table: trailing comma is not allowed in"
                    " an inline table",
                    {{source_location(loc), "should be `}`"}}),
                    source_location(loc));
            }
        }
    }
    loc.reset(first);
    throw syntax_error(format_underline("toml::parse_inline_table: "
            "inline table did not closed by `}`",
            {{source_location(loc), "should be closed"}}),
            source_location(loc));
}